

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void initialize_imputer<InputData<float,long>,long_double>
               (Imputer *imputer,InputData<float,_long> *input_data,size_t ntrees,int nthreads)

{
  vector<double,_std::allocator<double>_> *this;
  size_t sVar1;
  pointer pdVar2;
  float *pfVar3;
  long *plVar4;
  int *piVar5;
  pointer puVar6;
  pointer pdVar7;
  long lVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var9;
  long lVar10;
  pointer puVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  ulong uVar16;
  long lVar17;
  size_t sVar18;
  size_t col_1;
  double dVar19;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cat_counts;
  allocator_type local_69;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  double local_50;
  size_t local_48;
  double local_40;
  size_t local_38;
  
  imputer->ncols_numeric = input_data->ncols_numeric;
  sVar1 = input_data->ncols_categ;
  imputer->ncols_categ = sVar1;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
            ((vector<int,std::allocator<int>> *)&imputer->ncat,input_data->ncat,
             input_data->ncat + sVar1);
  this = &imputer->col_means;
  if ((imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::resize
              (this,input_data->ncols_numeric,(value_type_conflict *)&local_68);
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize(this,input_data->ncols_numeric);
    pdVar2 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar7 = (imputer->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar7 != pdVar2; pdVar7 = pdVar7 + 1) {
      *pdVar7 = 0.0;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&imputer->col_modes,input_data->ncols_categ);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::vector((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
            *)&local_68,ntrees,&local_69);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::_M_move_assign(&imputer->imputer_tree);
  std::
  vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
  ::~vector((vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             *)&local_68);
  pfVar3 = input_data->numeric_data;
  if (pfVar3 == (float *)0x0) {
    plVar4 = input_data->Xc_indptr;
    if (plVar4 != (long *)0x0) {
      uVar16 = 0;
      while (uVar16 < input_data->ncols_numeric) {
        local_48 = input_data->nrows;
        pfVar3 = input_data->Xc;
        lVar8 = plVar4[uVar16 + 1];
        pdVar7 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar10 = plVar4[uVar16]; lVar10 < lVar8; lVar10 = lVar10 + 1) {
          fVar15 = ABS(pfVar3[lVar10]);
          if ((uint)fVar15 < 0x7f800000) {
            dVar19 = (double)pfVar3[lVar10];
          }
          else {
            dVar19 = 0.0;
          }
          pdVar7[uVar16] = dVar19 + pdVar7[uVar16];
          local_48 = local_48 - (0x7f7fffff < (uint)fVar15);
        }
        pdVar7 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_50 = (double)((float)pdVar7[uVar16] /
                           ((float)(long)local_48 + (float)(&DAT_003250d8)[(long)local_48 < 0]));
        dVar19 = NAN;
        if (local_48 != 0) {
          dVar19 = local_50;
        }
        pdVar7[uVar16] = dVar19;
        uVar16 = uVar16 + 1;
      }
    }
  }
  else {
    lVar10 = 0;
    for (uVar16 = 0; uVar16 < input_data->ncols_numeric; uVar16 = uVar16 + 1) {
      sVar1 = input_data->nrows;
      pdVar7 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_38 = sVar1;
      for (sVar18 = 0; sVar1 != sVar18; sVar18 = sVar18 + 1) {
        fVar15 = *(float *)((long)pfVar3 + sVar18 * 4 + sVar1 * lVar10);
        fVar14 = ABS(fVar15);
        if ((uint)fVar14 < 0x7f800000) {
          dVar19 = (double)fVar15;
        }
        else {
          dVar19 = 0.0;
        }
        pdVar7[uVar16] = dVar19 + pdVar7[uVar16];
        local_38 = local_38 - (0x7f7fffff < (uint)fVar14);
      }
      pdVar7 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_40 = (double)((float)pdVar7[uVar16] /
                         ((float)(long)local_38 + (float)(&DAT_003250d8)[(long)local_38 < 0]));
      dVar19 = NAN;
      if (local_38 != 0) {
        dVar19 = local_40;
      }
      pdVar7[uVar16] = dVar19;
      lVar10 = lVar10 + 4;
    }
  }
  if (input_data->categ_data != (int *)0x0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,
               (long)input_data->max_categ,(allocator_type *)&local_69);
    lVar10 = 0;
    for (uVar16 = 0; puVar6 = local_68._M_impl.super__Vector_impl_data._M_start,
        puVar11 = local_68._M_impl.super__Vector_impl_data._M_start,
        uVar16 < input_data->ncols_categ; uVar16 = uVar16 + 1) {
      for (; puVar11 != local_68._M_impl.super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
        *puVar11 = 0;
      }
      uVar12 = input_data->nrows;
      lVar8 = uVar12 * lVar10;
      piVar5 = input_data->categ_data;
      for (uVar13 = 0; uVar13 < uVar12; uVar13 = uVar13 + 1) {
        lVar17 = (long)*(int *)((long)piVar5 + uVar13 * 4 + lVar8);
        if (-1 < lVar17) {
          local_68._M_impl.super__Vector_impl_data._M_start[lVar17] =
               local_68._M_impl.super__Vector_impl_data._M_start[lVar17] + 1;
          uVar12 = input_data->nrows;
        }
      }
      _Var9 = std::
              __max_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_68._M_impl.super__Vector_impl_data._M_start,
                         local_68._M_impl.super__Vector_impl_data._M_start +
                         input_data->ncat[uVar16]);
      (imputer->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar16] =
           (int)((ulong)((long)_Var9._M_current - (long)puVar6) >> 3);
      lVar10 = lVar10 + 4;
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_68);
  }
  return;
}

Assistant:

void initialize_imputer(Imputer &imputer, InputData &input_data, size_t ntrees, int nthreads)
{
    imputer.ncols_numeric  =  input_data.ncols_numeric;
    imputer.ncols_categ    =  input_data.ncols_categ;
    imputer.ncat.assign(input_data.ncat, input_data.ncat + input_data.ncols_categ);
    if (imputer.col_means.size())
    {
        imputer.col_means.resize(input_data.ncols_numeric);
        std::fill(imputer.col_means.begin(), imputer.col_means.end(), 0);
    }

    else
    {
        imputer.col_means.resize(input_data.ncols_numeric, 0);
    }

    imputer.col_modes.resize(input_data.ncols_categ);
    imputer.imputer_tree = std::vector<std::vector<ImputeNode>>(ntrees);

    /* TODO: here should use sample weights if specified as density */
    size_t offset, cnt;
    if (input_data.numeric_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) private(cnt, offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt    = input_data.nrows;
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.numeric_data[row + offset]))?
                                           input_data.numeric_data[row + offset] : 0;
                cnt -= is_na_or_inf(input_data.numeric_data[row + offset]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    else if (input_data.Xc_indptr != NULL)
    {
        #pragma omp parallel for schedule(dynamic) num_threads(nthreads) private(cnt) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_numeric; col++)
        {
            cnt = input_data.nrows;
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                imputer.col_means[col] += (!is_na_or_inf(input_data.Xc[ix]))?
                                           input_data.Xc[ix] : 0;
                cnt -= is_na_or_inf(input_data.Xc[ix]);
            }
            imputer.col_means[col] /= (ldouble_safe) cnt;
            if (!cnt) imputer.col_means[col] = NAN;
        }
    }

    if (input_data.categ_data != NULL)
    {
        std::vector<size_t> cat_counts(input_data.max_categ);
        #pragma omp parallel for schedule(static) num_threads(nthreads) firstprivate(cat_counts) private(offset) shared(input_data, imputer)
        for (size_t_for col = 0; col < (decltype(col))input_data.ncols_categ; col++)
        {
            std::fill(cat_counts.begin(), cat_counts.end(), 0);
            offset = col * input_data.nrows;
            for (size_t row = 0; row < input_data.nrows; row++)
            {
                if (input_data.categ_data[row + offset] >= 0)
                    cat_counts[input_data.categ_data[row + offset]]++;
            }
            imputer.col_modes[col] = (int) std::distance(cat_counts.begin(),
                                                         std::max_element(cat_counts.begin(),
                                                                           cat_counts.begin() + input_data.ncat[col]));
        }
    }
}